

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_zip_close(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int *piVar1;
  undefined8 *pChunk;
  void *pvVar2;
  long lVar3;
  SyMemBackend *pBackend;
  void *pvVar4;
  void *pChunk_00;
  void *pChunk_01;
  
  if ((((nArg < 1) || (((*apArg)->iFlags & 0x100) == 0)) ||
      (pChunk = (undefined8 *)((*apArg)->x).pOther, pChunk == (undefined8 *)0x0)) ||
     (*(int *)(pChunk + 10) != -0x21529ca6)) {
    jx9VmThrowError(pCtx->pVm,&pCtx->pFunc->sName,1,"Expecting a ZIP archive");
  }
  else {
    if (*(int *)(pChunk + 7) != 0) {
      pChunk_01 = (void *)pChunk[2];
      do {
        pvVar2 = *(void **)((long)pChunk_01 + 0x80);
        if ((void *)pChunk[2] == pChunk_01) {
          pChunk[2] = *(undefined8 *)((long)pChunk[2] + 0x80);
        }
        lVar3 = *(long *)((long)pChunk_01 + 0x88);
        if (lVar3 != 0) {
          *(void **)(lVar3 + 0x80) = pvVar2;
        }
        if (*(long *)((long)pChunk_01 + 0x80) != 0) {
          *(long *)(*(long *)((long)pChunk_01 + 0x80) + 0x88) = lVar3;
        }
        pBackend = (SyMemBackend *)*pChunk;
        if (*(int *)((long)pChunk_01 + 0x60) != 0) {
          pChunk_00 = *(void **)((long)pChunk_01 + 0x78);
          do {
            pvVar4 = *(void **)((long)pChunk_00 + 0x78);
            *(undefined4 *)((long)pChunk_00 + 0xa0) = 0x2661;
            SyMemBackendFree(pBackend,*(void **)((long)pChunk_00 + 0x50));
            SyMemBackendPoolFree(pBackend,pChunk_00);
            piVar1 = (int *)((long)pChunk_01 + 0x60);
            *piVar1 = *piVar1 + -1;
            pChunk_00 = pvVar4;
          } while (*piVar1 != 0);
        }
        *(undefined4 *)((long)pChunk_01 + 0xa0) = 0x2661;
        SyMemBackendFree(pBackend,*(void **)((long)pChunk_01 + 0x50));
        SyMemBackendPoolFree(pBackend,pChunk_01);
        piVar1 = (int *)(pChunk + 7);
        *piVar1 = *piVar1 + -1;
        pChunk_01 = pvVar2;
      } while (*piVar1 != 0);
    }
    SyMemBackendFree((SyMemBackend *)*pChunk,(void *)pChunk[3]);
    pChunk[1] = 0;
    *(undefined4 *)(pChunk + 10) = 0x2626;
    if (*(int *)(pChunk + 0xb) == 2) {
      SyBlobRelease((SyBlob *)(pChunk + 0xc));
    }
    else if (*(code **)(pChunk[0xe] + 0x110) != (code *)0x0) {
      (**(code **)(pChunk[0xe] + 0x110))(pChunk[0xc],pChunk[0xd]);
    }
    jx9_context_free_chunk(pCtx,pChunk);
  }
  return 0;
}

Assistant:

static int jx9Builtin_zip_close(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	SyArchive *pArchive;
	zip_raw_data *pRaw;
	if( nArg < 1 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments */
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Expecting a ZIP archive");
		return JX9_OK;
	}
	/* Point to the in-memory archive */
	pArchive = (SyArchive *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid ZIP archive */
	if( SXARCH_INVALID(pArchive) ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Expecting a ZIP archive");
		return JX9_OK;
	}
	/* Release the archive */
	SyArchiveRelease(pArchive);
	pRaw = (zip_raw_data *)&pArchive[1];
	if( pRaw->iType == ZIP_RAW_DATA_MEMBUF ){
		SyBlobRelease(&pRaw->raw.sBlob);
	}else{
		const jx9_vfs *pVfs = pRaw->raw.mmap.pVfs;
		if( pVfs->xUnmap ){
			/* Unmap the memory view */
			pVfs->xUnmap(pRaw->raw.mmap.pMap, pRaw->raw.mmap.nSize);
		}
	}
	/* Release the memory chunk */
	jx9_context_free_chunk(pCtx, pArchive);
	return JX9_OK;
}